

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O0

void sha256_calc(uint8_t *hash,void *input,size_t len)

{
  int iVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint32_t temp2;
  uint32_t maj;
  uint32_t s0_1;
  uint32_t temp1;
  uint32_t ch;
  uint32_t s1_1;
  uint32_t s1;
  uint32_t s0;
  uint8_t *p;
  uint32_t w [64];
  uint32_t ah [8];
  buffer_state state;
  uint8_t chunk [64];
  int local_50;
  int local_4c;
  int j;
  int i;
  uint32_t h [8];
  size_t len_local;
  void *input_local;
  uint8_t *hash_local;
  
  _j = 0xbb67ae856a09e667;
  h[0] = 0x3c6ef372;
  h[1] = 0xa54ff53a;
  h[2] = 0x510e527f;
  h[3] = 0x9b05688c;
  h[4] = 0x1f83d9ab;
  h[5] = 0x5be0cd19;
  init_buf_state((buffer_state *)(ah + 6),input,len);
  while (iVar1 = calc_chunk((uint8_t *)&state.single_one_delivered,(buffer_state *)(ah + 6)),
        iVar1 != 0) {
    _s1 = &state.single_one_delivered;
    memset(&p,0,0x100);
    for (local_4c = 0; local_4c < 0x10; local_4c = local_4c + 1) {
      w[(long)local_4c + -2] =
           (uint)(byte)*_s1 << 0x18 | (uint)*(byte *)((long)_s1 + 1) << 0x10 |
           (uint)*(byte *)((long)_s1 + 2) << 8 | (uint)*(byte *)((long)_s1 + 3);
      _s1 = _s1 + 1;
    }
    for (local_4c = 0x10; local_4c < 0x40; local_4c = local_4c + 1) {
      uVar2 = right_rot(w[(long)(local_4c + -0xf) + -2],7);
      uVar3 = right_rot(w[(long)(local_4c + -0xf) + -2],0x12);
      uVar6 = w[(long)(local_4c + -0xf) + -2];
      uVar4 = right_rot(w[(long)(local_4c + -2) + -2],0x11);
      uVar5 = right_rot(w[(long)(local_4c + -2) + -2],0x13);
      w[(long)local_4c + -2] =
           w[(long)(local_4c + -0x10) + -2] + (uVar2 ^ uVar3 ^ uVar6 >> 3) +
           w[(long)(local_4c + -7) + -2] + (uVar4 ^ uVar5 ^ w[(long)(local_4c + -2) + -2] >> 10);
    }
    for (local_4c = 0; local_4c < 8; local_4c = local_4c + 1) {
      w[(long)local_4c + 0x3e] = (&j)[local_4c];
    }
    for (local_4c = 0; local_4c < 0x40; local_4c = local_4c + 1) {
      uVar2 = right_rot(ah[2],6);
      uVar3 = right_rot(ah[2],0xb);
      uVar4 = right_rot(ah[2],0x19);
      iVar1 = ah[5] + (uVar2 ^ uVar3 ^ uVar4) + (ah[2] & ah[3] ^ (ah[2] ^ 0xffffffff) & ah[4]) +
              k[local_4c] + w[(long)local_4c + -2];
      uVar2 = right_rot(w[0x3e],2);
      uVar3 = right_rot(w[0x3e],0xd);
      uVar4 = right_rot(w[0x3e],0x16);
      uVar6 = w[0x3e] & w[0x3f];
      uVar7 = w[0x3e] & ah[0];
      uVar8 = w[0x3f] & ah[0];
      ah[5] = ah[4];
      ah[4] = ah[3];
      ah[3] = ah[2];
      ah[2] = ah[1] + iVar1;
      ah[1] = ah[0];
      ah[0] = w[0x3f];
      w[0x3f] = w[0x3e];
      w[0x3e] = iVar1 + (uVar2 ^ uVar3 ^ uVar4) + (uVar6 ^ uVar7 ^ uVar8);
    }
    for (local_4c = 0; local_4c < 8; local_4c = local_4c + 1) {
      (&j)[local_4c] = w[(long)local_4c + 0x3e] + (&j)[local_4c];
    }
  }
  local_50 = 0;
  for (local_4c = 0; local_4c < 8; local_4c = local_4c + 1) {
    hash[local_50] = (uint8_t)((uint)(&j)[local_4c] >> 0x18);
    hash[local_50 + 1] = (uint8_t)((uint)(&j)[local_4c] >> 0x10);
    iVar1 = local_50 + 3;
    hash[local_50 + 2] = (uint8_t)((uint)(&j)[local_4c] >> 8);
    local_50 = local_50 + 4;
    hash[iVar1] = (uint8_t)(&j)[local_4c];
  }
  return;
}

Assistant:

void sha256_calc(uint8_t hash[32], const void * input, size_t len)
{
   uint32_t h[] = { 0x6a09e667, 0xbb67ae85, 0x3c6ef372, 0xa54ff53a, 0x510e527f, 0x9b05688c, 0x1f83d9ab, 0x5be0cd19 };
   int i, j;

   uint8_t chunk[64];

   struct buffer_state state;

   init_buf_state(&state, input, len);

   while (calc_chunk(chunk, &state)) {
      uint32_t ah[8];

      uint32_t w[64];
      const uint8_t *p = chunk;

      memset(w, 0x00, sizeof w);
      for (i = 0; i < 16; i++) {
         w[i] = (uint32_t) p[0] << 24 | (uint32_t) p[1] << 16 |
            (uint32_t) p[2] << 8 | (uint32_t) p[3];
         p += 4;
      }

      for (i = 16; i < 64; i++) {
         const uint32_t s0 = right_rot(w[i - 15], 7) ^ right_rot(w[i - 15], 18) ^ (w[i - 15] >> 3);
         const uint32_t s1 = right_rot(w[i - 2], 17) ^ right_rot(w[i - 2], 19) ^ (w[i - 2] >> 10);
         w[i] = w[i - 16] + s0 + w[i - 7] + s1;
      }

      for (i = 0; i < 8; i++)
         ah[i] = h[i];

      for (i = 0; i < 64; i++) {
         const uint32_t s1 = right_rot(ah[4], 6) ^ right_rot(ah[4], 11) ^ right_rot(ah[4], 25);
         const uint32_t ch = (ah[4] & ah[5]) ^ (~ah[4] & ah[6]);
         const uint32_t temp1 = ah[7] + s1 + ch + k[i] + w[i];
         const uint32_t s0 = right_rot(ah[0], 2) ^ right_rot(ah[0], 13) ^ right_rot(ah[0], 22);
         const uint32_t maj = (ah[0] & ah[1]) ^ (ah[0] & ah[2]) ^ (ah[1] & ah[2]);
         const uint32_t temp2 = s0 + maj;

         ah[7] = ah[6];
         ah[6] = ah[5];
         ah[5] = ah[4];
         ah[4] = ah[3] + temp1;
         ah[3] = ah[2];
         ah[2] = ah[1];
         ah[1] = ah[0];
         ah[0] = temp1 + temp2;
      }

      for (i = 0; i < 8; i++)
         h[i] += ah[i];
   }

   for (i = 0, j = 0; i < 8; i++)
   {
      hash[j++] = (uint8_t) (h[i] >> 24);
      hash[j++] = (uint8_t) (h[i] >> 16);
      hash[j++] = (uint8_t) (h[i] >> 8);
      hash[j++] = (uint8_t) h[i];
   }
}